

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O0

void __thiscall dynamicgraph::Tracer::openFile(Tracer *this,SignalBase<int> *sig,string *givenname)

{
  long lVar1;
  ofstream *poVar2;
  undefined8 uVar3;
  ofstream *local_e0;
  ofstream *local_d8;
  ofstream *newfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string filename;
  undefined1 local_40 [8];
  string signame;
  string *givenname_local;
  SignalBase<int> *sig_local;
  Tracer *this_local;
  
  signame.field_2._8_8_ = givenname;
  std::__cxx11::string::string((string *)local_40);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    SignalBase<int>::shortName_abi_cxx11_((string *)((long)&filename.field_2 + 8),sig);
    std::__cxx11::string::operator=
              ((string *)local_40,(string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,(string *)signame.field_2._8_8_);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newfile,
                 &this->rootdir,&this->basename);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newfile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,&this->suffix);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&newfile);
  poVar2 = (ofstream *)operator_new(0x200);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(poVar2,uVar3,0x10);
  local_e0 = poVar2;
  local_d8 = poVar2;
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::push_back(&this->files,(value_type *)&local_e0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Tracer::openFile(const SignalBase<int> &sig, const string &givenname) {
  dgDEBUGIN(15);
  string signame;
  if (givenname.length()) {
    signame = givenname;
  } else {
    signame = sig.shortName();
  }

  string filename = rootdir + basename + signame + suffix;

  dgDEBUG(5) << "Sig <" << sig.getName() << ">: new file " << filename << endl;
  std::ofstream *newfile = new std::ofstream(filename.c_str());
  files.push_back(newfile);
  dgDEBUGOUT(15);
}